

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebugServerJson.cxx
# Opt level: O2

string * __thiscall
cmDebugServerJson::StatusString_abi_cxx11_(string *__return_storage_ptr__,cmDebugServerJson *this)

{
  Int value_00;
  bool bVar1;
  int iVar2;
  SnapshotType SVar3;
  LongLong value_01;
  Value *pVVar4;
  cmListFileContext *pcVar5;
  Value *pVVar6;
  Int local_3f4;
  cmPauseContext ctx;
  Value value;
  cmListFileBacktrace backtrace;
  cmStateSnapshot local_388;
  Value back;
  Value local_340;
  Value local_318;
  Value local_2f0;
  Value local_2c8;
  string state;
  Value local_280;
  Value local_258;
  Value local_230;
  Value local_208;
  Value local_1e0;
  Value local_1b8;
  Value local_190;
  Value local_168;
  Value local_140;
  Value local_118;
  Value frame;
  cmListFileContext currentLine;
  Value local_80;
  Value local_58;
  
  std::__cxx11::string::string((string *)&state,"",(allocator *)&currentLine);
  Json::Value::Value(&value,nullValue);
  value_01 = cmsys::SystemInformation::GetProcessId(&::info);
  Json::Value::Value(&local_2c8,value_01);
  pVVar4 = Json::Value::operator[](&value,"PID");
  Json::Value::operator=(pVVar4,&local_2c8);
  Json::Value::~Value(&local_2c8);
  iVar2 = (*((this->super_cmDebugServer).super_cmDebuggerListener.Debugger)->_vptr_cmDebugger[9])();
  if (iVar2 == 0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&currentLine);
    goto LAB_0041f563;
  }
  if (iVar2 == 1) {
    Json::Value::Value(&local_2f0,"Running");
    pVVar4 = Json::Value::operator[](&value,"State");
    Json::Value::operator=(pVVar4,&local_2f0);
    pVVar4 = &local_2f0;
LAB_0041f54f:
    Json::Value::~Value(pVVar4);
  }
  else if (iVar2 == 2) {
    Json::Value::Value(&local_318,"Paused");
    pVVar4 = Json::Value::operator[](&value,"State");
    Json::Value::operator=(pVVar4,&local_318);
    Json::Value::~Value(&local_318);
    Json::Value::Value(&back,arrayValue);
    (*((this->super_cmDebugServer).super_cmDebuggerListener.Debugger)->_vptr_cmDebugger[0x17])(&ctx)
    ;
    bVar1 = cmPauseContext::operator_cast_to_bool(&ctx);
    if (bVar1) {
      cmPauseContext::CurrentLine(&currentLine,&ctx);
      cmPauseContext::GetBacktrace(&backtrace,&ctx);
      local_3f4 = 0;
      while (pcVar5 = cmListFileBacktrace::Top(&backtrace), (pcVar5->FilePath)._M_string_length != 0
            ) {
        pcVar5 = cmListFileBacktrace::Top(&backtrace);
        value_00 = (Int)pcVar5->Line;
        if (value_00 != 0) {
          Json::Value::Value(&frame,objectValue);
          Json::Value::Value(&local_58,local_3f4);
          pVVar4 = Json::Value::operator[](&frame,"ID");
          Json::Value::operator=(pVVar4,&local_58);
          Json::Value::~Value(&local_58);
          pcVar5 = cmListFileBacktrace::Top(&backtrace);
          Json::Value::Value(&local_80,&pcVar5->FilePath);
          pVVar4 = Json::Value::operator[](&frame,"File");
          Json::Value::operator=(pVVar4,&local_80);
          Json::Value::~Value(&local_80);
          Json::Value::Value(&local_118,value_00);
          pVVar4 = Json::Value::operator[](&frame,"Line");
          Json::Value::operator=(pVVar4,&local_118);
          Json::Value::~Value(&local_118);
          pcVar5 = cmListFileBacktrace::Top(&backtrace);
          Json::Value::Value(&local_140,&pcVar5->Name);
          pVVar4 = Json::Value::operator[](&frame,"Name");
          Json::Value::operator=(pVVar4,&local_140);
          Json::Value::~Value(&local_140);
          local_388.Position.Position = backtrace.Bottom.Position.Position;
          local_388.State = backtrace.Bottom.State;
          local_388.Position.Tree = backtrace.Bottom.Position.Tree;
          SVar3 = cmStateSnapshot::GetType(&local_388);
          switch(SVar3) {
          case BaseType:
            Json::Value::Value(&local_168,"BaseType");
            pVVar6 = Json::Value::operator[](&frame,"Type");
            pVVar4 = &local_168;
            Json::Value::operator=(pVVar6,pVVar4);
            break;
          case BuildsystemDirectoryType:
            Json::Value::Value(&local_190,"BuildsystemDirectoryType");
            pVVar6 = Json::Value::operator[](&frame,"Type");
            pVVar4 = &local_190;
            Json::Value::operator=(pVVar6,pVVar4);
            break;
          case FunctionCallType:
            Json::Value::Value(&local_1b8,"FunctionCallType");
            pVVar6 = Json::Value::operator[](&frame,"Type");
            pVVar4 = &local_1b8;
            Json::Value::operator=(pVVar6,pVVar4);
            break;
          case MacroCallType:
            Json::Value::Value(&local_1e0,"MacroCallType");
            pVVar6 = Json::Value::operator[](&frame,"Type");
            pVVar4 = &local_1e0;
            Json::Value::operator=(pVVar6,pVVar4);
            break;
          case IncludeFileType:
            Json::Value::Value(&local_208,"IncludeFileType");
            pVVar6 = Json::Value::operator[](&frame,"Type");
            pVVar4 = &local_208;
            Json::Value::operator=(pVVar6,pVVar4);
            break;
          case InlineListFileType:
            Json::Value::Value(&local_230,"InlineListFileType");
            pVVar6 = Json::Value::operator[](&frame,"Type");
            pVVar4 = &local_230;
            Json::Value::operator=(pVVar6,pVVar4);
            break;
          case PolicyScopeType:
            Json::Value::Value(&local_258,"PolicyScopeType");
            pVVar6 = Json::Value::operator[](&frame,"Type");
            pVVar4 = &local_258;
            Json::Value::operator=(pVVar6,pVVar4);
            break;
          case VariableScopeType:
            Json::Value::Value(&local_280,"VariableScopeType");
            pVVar6 = Json::Value::operator[](&frame,"Type");
            pVVar4 = &local_280;
            Json::Value::operator=(pVVar6,pVVar4);
            break;
          default:
            goto switchD_0041f26d_default;
          }
          Json::Value::~Value(pVVar4);
switchD_0041f26d_default:
          Json::Value::append(&back,&frame);
          local_3f4 = local_3f4 + 1;
          Json::Value::~Value(&frame);
        }
        cmListFileBacktrace::Pop((cmListFileBacktrace *)&frame,&backtrace);
        cmListFileBacktrace::operator=(&backtrace,(cmListFileBacktrace *)&frame);
        cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&frame);
      }
      Json::Value::Value(&local_340,&back);
      pVVar4 = Json::Value::operator[](&value,"Backtrace");
      Json::Value::operator=(pVVar4,&local_340);
      Json::Value::~Value(&local_340);
      cmListFileBacktrace::~cmListFileBacktrace(&backtrace);
      cmListFileContext::~cmListFileContext(&currentLine);
    }
    std::unique_lock<std::recursive_timed_mutex>::~unique_lock(&ctx.Lock);
    pVVar4 = &back;
    goto LAB_0041f54f;
  }
  Json::Value::toStyledString_abi_cxx11_(__return_storage_ptr__,&value);
LAB_0041f563:
  Json::Value::~Value(&value);
  std::__cxx11::string::~string((string *)&state);
  return __return_storage_ptr__;
}

Assistant:

std::string cmDebugServerJson::StatusString() const
{
  std::string state = "";
  Json::Value value;
  value["PID"] = info.GetProcessId();

  switch (Debugger.CurrentState()) {
    case cmDebugger::State::Running:
      value["State"] = "Running";
      break;
    case cmDebugger::State::Paused: {
      value["State"] = "Paused";
      Json::Value back(Json::arrayValue);

      if (auto ctx = Debugger.PauseContext()) {
        auto currentLine = ctx.CurrentLine();
        auto backtrace = ctx.GetBacktrace();
        int id = 0;
        while (!backtrace.Top().FilePath.empty()) {
          auto line = Json::Value::Int(backtrace.Top().Line);
          if (line != 0) {
            Json::Value frame(Json::objectValue);
            frame["ID"] = id++;
            frame["File"] = backtrace.Top().FilePath;
            frame["Line"] = line;
            frame["Name"] = backtrace.Top().Name;

            switch (backtrace.GetBottom().GetType()) {
              case cmStateEnums::BaseType:
                frame["Type"] = "BaseType";
                break;
              case cmStateEnums::BuildsystemDirectoryType:
                frame["Type"] = "BuildsystemDirectoryType";
                break;
              case cmStateEnums::FunctionCallType:
                frame["Type"] = "FunctionCallType";
                break;
              case cmStateEnums::MacroCallType:
                frame["Type"] = "MacroCallType";
                break;
              case cmStateEnums::IncludeFileType:
                frame["Type"] = "IncludeFileType";
                break;
              case cmStateEnums::InlineListFileType:
                frame["Type"] = "InlineListFileType";
                break;
              case cmStateEnums::PolicyScopeType:
                frame["Type"] = "PolicyScopeType";
                break;
              case cmStateEnums::VariableScopeType:
                frame["Type"] = "VariableScopeType";
                break;
            }

            back.append(frame);
          }
          backtrace = backtrace.Pop();
        }
        value["Backtrace"] = back;
      }

    } break;
    case cmDebugger::State::Unknown:
      return "";
  }

  return value.toStyledString();
}